

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ReserveResourceSignatures
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,PipelineStateCreateInfo *CreateInfo
          ,FixedLinearAllocator *MemPool)

{
  byte bVar1;
  IPipelineResourceSignature *pSrcPtr;
  uint uVar2;
  char (*in_RCX) [86];
  char (*in_R8) [82];
  uint uVar3;
  string msg;
  char (*in_stack_ffffffffffffff88) [78];
  string local_70;
  uint local_4c;
  char local_48 [4];
  uint local_44;
  FixedLinearAllocator *local_40;
  PipelineStateBase<Diligent::EngineGLImplTraits> *local_38;
  
  if ((this->m_UsingImplicitSignature == true) &&
     (((byte *)CreateInfo->pInternalData == (byte *)0x0 || ((*CreateInfo->pInternalData & 1) == 0)))
     ) {
    if ((CreateInfo->ResourceSignaturesCount != 0) &&
       (CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0)) {
      FormatString<char[26],char[86]>
                (&local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr"
                 ,in_RCX);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4db);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    this->m_SignatureCount = '\x01';
  }
  else {
    if ((CreateInfo->ResourceSignaturesCount == 0) ||
       (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
      FormatString<char[26],char[85]>
                (&local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr"
                 ,(char (*) [85])in_RCX);
      in_RCX = (char (*) [86])0x4e0;
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    local_4c = 0;
    local_40 = MemPool;
    local_38 = this;
    if (CreateInfo->ResourceSignaturesCount == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        in_RCX = (char (*) [86])CreateInfo->ppResourceSignatures;
        pSrcPtr = *(IPipelineResourceSignature **)(*in_RCX + (ulong)local_4c * 8);
        if (pSrcPtr == (IPipelineResourceSignature *)0x0) {
          FormatString<char[38],unsigned_int,char[82]>
                    (&local_70,(Diligent *)"Pipeline resource signature at index ",
                     (char (*) [38])&local_4c,
                     (uint *)
                     " is null. This error should\'ve been caught by ValidatePipelineResourceSignatures."
                     ,in_R8);
          in_RCX = (char (*) [86])0x4e5;
          DebugAssertionFailed
                    (local_70._M_dataplus._M_p,"ReserveResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x4e5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          CheckDynamicType<Diligent::PipelineResourceSignatureGLImpl,Diligent::IPipelineResourceSignature>
                    (pSrcPtr);
        }
        bVar1 = *(byte *)((long)&pSrcPtr[7].super_IDeviceObject.super_IObject._vptr_IObject + 4);
        if (7 < bVar1) {
          local_48[0] = '\a';
          local_48[1] = '\0';
          local_48[2] = '\0';
          local_48[3] = '\0';
          in_R8 = (char (*) [82])local_48;
          local_44 = (uint)bVar1;
          FormatString<char[53],unsigned_int,char[26],unsigned_int,char[78]>
                    (&local_70,(Diligent *)"Pipeline resource signature specifies binding index ",
                     (char (*) [53])&local_44,(uint *)" that exceeds the limit (",
                     (char (*) [26])in_R8,
                     (uint *)
                     "). This error should\'ve been caught by ValidatePipelineResourceSignatureDesc."
                     ,in_stack_ffffffffffffff88);
          in_RCX = (char (*) [86])0x4ea;
          DebugAssertionFailed
                    (local_70._M_dataplus._M_p,"ReserveResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x4ea);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        uVar2 = (uint)bVar1;
        if (bVar1 < uVar3) {
          uVar2 = uVar3;
        }
        uVar3 = uVar2;
        local_4c = local_4c + 1;
      } while (local_4c < CreateInfo->ResourceSignaturesCount);
    }
    this = local_38;
    if (7 < uVar3) {
      FormatString<char[26],char[51]>
                (&local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES",
                 (char (*) [51])in_RCX);
      in_RCX = (char (*) [86])0x4ee;
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4ee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    MemPool = local_40;
    this->m_SignatureCount = (Uint8)(uVar3 + 1);
    if (uVar3 + 1 != (uVar3 + 1 & 0xff)) {
      FormatString<char[26],char[49]>
                (&local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_SignatureCount == MaxSignatureBindingIndex + 1",
                 (char (*) [49])in_RCX);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  FixedLinearAllocator::AddSpace(MemPool,(ulong)this->m_SignatureCount << 3,8);
  return;
}

Assistant:

void ReserveResourceSignatures(const PipelineStateCreateInfo& CreateInfo, FixedLinearAllocator& MemPool)
    {
        if (m_UsingImplicitSignature && (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr);
            m_SignatureCount = 1;
        }
        else
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr);
            Uint32 MaxSignatureBindingIndex = 0;
            for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
            {
                const PipelineResourceSignatureImplType* pSignature = ClassPtrCast<PipelineResourceSignatureImplType>(CreateInfo.ppResourceSignatures[i]);
                VERIFY(pSignature != nullptr, "Pipeline resource signature at index ", i, " is null. This error should've been caught by ValidatePipelineResourceSignatures.");

                Uint32 Index = pSignature->GetDesc().BindingIndex;
                VERIFY(Index < MAX_RESOURCE_SIGNATURES,
                       "Pipeline resource signature specifies binding index ", Uint32{Index}, " that exceeds the limit (", MAX_RESOURCE_SIGNATURES - 1,
                       "). This error should've been caught by ValidatePipelineResourceSignatureDesc.");

                MaxSignatureBindingIndex = std::max(MaxSignatureBindingIndex, Uint32{Index});
            }
            VERIFY_EXPR(MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES);
            m_SignatureCount = static_cast<decltype(m_SignatureCount)>(MaxSignatureBindingIndex + 1);
            VERIFY_EXPR(m_SignatureCount == MaxSignatureBindingIndex + 1);
        }

        MemPool.AddSpace<SignatureAutoPtrType>(m_SignatureCount);
    }